

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLBigDecimal.cpp
# Opt level: O3

int __thiscall xercesc_4_0::XMLBigDecimal::toCompare(XMLBigDecimal *this,XMLBigDecimal *other)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  
  iVar1 = (*(this->super_XMLNumber).super_XSerializable._vptr_XSerializable[7])();
  iVar2 = (*(other->super_XMLNumber).super_XSerializable._vptr_XSerializable[7])(other);
  if (iVar1 == iVar2) {
    if (iVar1 == 0) {
      iVar1 = 0;
    }
    else {
      uVar3 = this->fTotalDigits - this->fScale;
      uVar4 = other->fTotalDigits - other->fScale;
      if (uVar3 <= uVar4) {
        if (uVar3 < uVar4) {
          iVar1 = -iVar1;
        }
        else {
          iVar2 = XMLString::compareString(this->fIntVal,other->fIntVal);
          if ((iVar2 < 1) && (iVar1 = -iVar1, iVar2 == 0)) {
            iVar1 = 0;
          }
        }
      }
    }
  }
  else {
    iVar2 = (*(other->super_XMLNumber).super_XSerializable._vptr_XSerializable[7])(other);
    iVar1 = (uint)(iVar2 < iVar1) * 2 + -1;
  }
  return iVar1;
}

Assistant:

int XMLBigDecimal::toCompare(const XMLBigDecimal& other) const
{
    /***
     * different sign
     */
    int lSign = this->getSign();
    if (lSign != other.getSign())
        return (lSign > other.getSign() ? 1 : -1);

    /***
     * same sign, zero
     */
    if (lSign == 0)    // optimization
        return 0;

    /***
     * same sign, non-zero
     */
    unsigned int lIntDigit = this->getTotalDigit() - this->getScale();
    unsigned int rIntDigit = other.getTotalDigit() - other.getScale();

    if (lIntDigit > rIntDigit)
    {
        return 1 * lSign;
    }
    else if (lIntDigit < rIntDigit)
    {
        return -1 * lSign;
    }
    else  // compare fraction
    {
        int res = XMLString::compareString
        ( this->getValue()
        , other.getValue()
        );

        if (res > 0)
            return 1 * lSign;
        else if (res < 0)
            return -1 * lSign;
        else
            return 0;
    }

}